

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_info.cpp
# Opt level: O1

NamesAndLabels * __thiscall
DebugUtilsData::PopulateNamesAndLabels
          (NamesAndLabels *__return_storage_ptr__,DebugUtilsData *this,
          vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *objects)

{
  pointer pXVar1;
  NamesAndLabels *pNVar2;
  XrSdkLogObjectInfo *obj;
  pointer info;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *__range1;
  vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_> labels;
  vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_> local_88;
  NamesAndLabels *local_68;
  vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_> local_60;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_48;
  
  local_88.super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  info = (objects->super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>).
         _M_impl.super__Vector_impl_data._M_start;
  pXVar1 = (objects->super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  local_68 = __return_storage_ptr__;
  if (info != pXVar1) {
    do {
      ObjectInfoCollection::LookUpObjectName(&this->object_info_,info);
      if (info->type == XR_OBJECT_TYPE_SESSION) {
        LookUpSessionLabels(this,(XrSession)info->handle,&local_88);
      }
      info = info + 1;
    } while (info != pXVar1);
  }
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(&local_48,objects);
  std::vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>::vector
            (&local_60,&local_88);
  pNVar2 = local_68;
  NamesAndLabels::NamesAndLabels(local_68,&local_48,&local_60);
  if (local_60.super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_48);
  if (local_88.super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pNVar2;
}

Assistant:

NamesAndLabels DebugUtilsData::PopulateNamesAndLabels(std::vector<XrSdkLogObjectInfo> objects) const {
    std::vector<XrDebugUtilsLabelEXT> labels;
    for (auto& obj : objects) {
        // Check for any names that have been associated with the objects and set them up here
        object_info_.LookUpObjectName(obj);
        // If this is a session, see if there are any labels associated with it for us to add
        // to the callback content.
        if (XR_OBJECT_TYPE_SESSION == obj.type) {
            LookUpSessionLabels(obj.GetTypedHandle<XrSession>(), labels);
        }
    }

    return {objects, labels};
}